

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlAddNextSibling(xmlNodePtr cur,xmlNodePtr elem)

{
  xmlChar *pxVar1;
  xmlNodePtr pxVar2;
  xmlChar *tmp;
  xmlNodePtr elem_local;
  xmlNodePtr cur_local;
  
  if ((cur == (xmlNodePtr)0x0) || (cur->type == XML_NAMESPACE_DECL)) {
    cur_local = (xmlNodePtr)0x0;
  }
  else if ((elem == (xmlNodePtr)0x0) || (elem->type == XML_NAMESPACE_DECL)) {
    cur_local = (xmlNodePtr)0x0;
  }
  else if (cur == elem) {
    cur_local = (xmlNodePtr)0x0;
  }
  else {
    xmlUnlinkNode(elem);
    if (elem->type == XML_TEXT_NODE) {
      if (cur->type == XML_TEXT_NODE) {
        xmlNodeAddContent(cur,elem->content);
        xmlFreeNode(elem);
        return cur;
      }
      if (((cur->next != (_xmlNode *)0x0) && (cur->next->type == XML_TEXT_NODE)) &&
         (cur->name == cur->next->name)) {
        pxVar1 = xmlStrdup(elem->content);
        pxVar1 = xmlStrcat(pxVar1,cur->next->content);
        xmlNodeSetContent(cur->next,pxVar1);
        (*xmlFree)(pxVar1);
        xmlFreeNode(elem);
        return cur->next;
      }
    }
    else if (elem->type == XML_ATTRIBUTE_NODE) {
      pxVar2 = xmlAddPropSibling(cur,cur,elem);
      return pxVar2;
    }
    if (elem->doc != cur->doc) {
      xmlSetTreeDoc(elem,cur->doc);
    }
    elem->parent = cur->parent;
    elem->prev = cur;
    elem->next = cur->next;
    cur->next = elem;
    if (elem->next != (_xmlNode *)0x0) {
      elem->next->prev = elem;
    }
    cur_local = elem;
    if ((elem->parent != (_xmlNode *)0x0) && (elem->parent->last == cur)) {
      elem->parent->last = elem;
    }
  }
  return cur_local;
}

Assistant:

xmlNodePtr
xmlAddNextSibling(xmlNodePtr cur, xmlNodePtr elem) {
    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddNextSibling : cur == NULL\n");
#endif
	return(NULL);
    }
    if ((elem == NULL) || (elem->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddNextSibling : elem == NULL\n");
#endif
	return(NULL);
    }

    if (cur == elem) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddNextSibling : cur == elem\n");
#endif
	return(NULL);
    }

    xmlUnlinkNode(elem);

    if (elem->type == XML_TEXT_NODE) {
	if (cur->type == XML_TEXT_NODE) {
	    xmlNodeAddContent(cur, elem->content);
	    xmlFreeNode(elem);
	    return(cur);
	}
	if ((cur->next != NULL) && (cur->next->type == XML_TEXT_NODE) &&
            (cur->name == cur->next->name)) {
	    xmlChar *tmp;

	    tmp = xmlStrdup(elem->content);
	    tmp = xmlStrcat(tmp, cur->next->content);
	    xmlNodeSetContent(cur->next, tmp);
	    xmlFree(tmp);
	    xmlFreeNode(elem);
	    return(cur->next);
	}
    } else if (elem->type == XML_ATTRIBUTE_NODE) {
		return xmlAddPropSibling(cur, cur, elem);
    }

    if (elem->doc != cur->doc) {
	xmlSetTreeDoc(elem, cur->doc);
    }
    elem->parent = cur->parent;
    elem->prev = cur;
    elem->next = cur->next;
    cur->next = elem;
    if (elem->next != NULL)
	elem->next->prev = elem;
    if ((elem->parent != NULL) && (elem->parent->last == cur))
	elem->parent->last = elem;
    return(elem);
}